

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.h
# Opt level: O0

void __thiscall CP::stack<int>::push(stack<int> *this,int *element)

{
  int *element_local;
  stack<int> *this_local;
  
  if (this->mCap < this->mSize + 1) {
    expand(this,this->mCap << 1);
  }
  this->mData[this->mSize] = *element;
  this->mSize = this->mSize + 1;
  return;
}

Assistant:

void push(const T& element) {  // Theta(n)
      if (mSize + 1 > mCap) 
        expand(mCap * 2);
      mData[mSize] = element;
      mSize++;
    }